

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzma_encoder.c
# Opt level: O3

lzma_ret lzma_lzma_encoder_reset(lzma_lzma1_encoder *coder,lzma_options_lzma *options)

{
  probability *ppVar1;
  undefined1 auVar2 [16];
  _Bool _Var3;
  lzma_ret lVar4;
  uint uVar5;
  probability (*papVar6) [64];
  uint uVar7;
  size_t i_1;
  probability (*papVar8) [16];
  probability (*papVar9) [768];
  long lVar10;
  uint uVar11;
  long lVar12;
  ulong uVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  int iVar18;
  int iVar24;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  
  _Var3 = is_options_valid(options);
  lVar4 = LZMA_OPTIONS_ERROR;
  if (_Var3) {
    uVar5 = -1 << ((byte)options->pb & 0x1f);
    coder->pos_mask = ~uVar5;
    coder->literal_context_bits = options->lc;
    coder->literal_pos_mask = ~(-1 << ((byte)options->lp & 0x1f));
    (coder->rc).low = 0;
    (coder->rc).cache_size = 1;
    (coder->rc).range = 0xffffffff;
    (coder->rc).cache = '\0';
    (coder->rc).count = 0;
    (coder->rc).pos = 0;
    coder->state = STATE_LIT_LIT;
    coder->reps[0] = 0;
    coder->reps[1] = 0;
    coder->reps[2] = 0;
    coder->reps[3] = 0;
    uVar7 = options->lp + options->lc;
    if (4 < uVar7) {
      __assert_fail("lc + lp <= LZMA_LCLP_MAX",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmliblzma/liblzma/lzma/lzma_common.h"
                    ,0x85,"void literal_init(probability (*)[768], uint32_t, uint32_t)");
    }
    papVar9 = coder->literal;
    uVar11 = 0;
    do {
      lVar12 = 0;
      do {
        ppVar1 = *papVar9 + lVar12;
        ppVar1[0] = 0x400;
        ppVar1[1] = 0x400;
        ppVar1[2] = 0x400;
        ppVar1[3] = 0x400;
        ppVar1[4] = 0x400;
        ppVar1[5] = 0x400;
        ppVar1[6] = 0x400;
        ppVar1[7] = 0x400;
        lVar12 = lVar12 + 8;
      } while (lVar12 != 0x300);
      uVar11 = uVar11 + 1;
      papVar9 = papVar9 + 1;
    } while (uVar11 >> ((byte)uVar7 & 0x1f) == 0);
    papVar8 = coder->is_rep0_long;
    lVar12 = 0;
    do {
      uVar13 = 0;
      do {
        papVar8[-0xf][uVar13] = 0x400;
        (*papVar8)[uVar13] = 0x400;
        uVar13 = uVar13 + 1;
      } while (-uVar5 != uVar13);
      coder->is_rep[lVar12] = 0x400;
      coder->is_rep0[lVar12] = 0x400;
      coder->is_rep1[lVar12] = 0x400;
      coder->is_rep2[lVar12] = 0x400;
      auVar2 = _DAT_0025f4a0;
      lVar12 = lVar12 + 1;
      papVar8 = papVar8 + 1;
    } while (lVar12 != 0xc);
    lVar12 = 0;
    auVar14 = _DAT_00262a50;
    auVar15 = _DAT_00262a60;
    auVar16 = _DAT_00262a70;
    auVar17 = _DAT_0025f490;
    do {
      auVar19 = auVar17 ^ auVar2;
      iVar18 = auVar19._0_4_;
      iVar24 = auVar19._8_4_;
      auVar25._4_4_ = iVar18;
      auVar25._0_4_ = iVar18;
      auVar25._8_4_ = iVar24;
      auVar25._12_4_ = iVar24;
      auVar29._0_4_ = -(uint)(iVar18 < -0x7fffff8e);
      auVar29._4_4_ = -(uint)(iVar18 < -0x7fffff8e);
      auVar29._8_4_ = -(uint)(iVar24 < -0x7fffff8e);
      auVar29._12_4_ = -(uint)(iVar24 < -0x7fffff8e);
      auVar20._0_4_ = -(uint)(auVar19._4_4_ == -0x80000000);
      auVar20._4_4_ = -(uint)(auVar19._4_4_ == -0x80000000);
      auVar20._8_4_ = -(uint)(auVar19._12_4_ == -0x80000000);
      auVar20._12_4_ = -(uint)(auVar19._12_4_ == -0x80000000);
      auVar20 = auVar20 & auVar29;
      auVar19 = pshuflw(auVar25,auVar20,0xe8);
      auVar19 = packssdw(auVar19,auVar19);
      if ((auVar19 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        coder->dist_special[lVar12] = 0x400;
      }
      auVar19 = packssdw(auVar20,auVar20);
      auVar19 = packssdw(auVar19,auVar19);
      if ((auVar19._0_4_ >> 0x10 & 1) != 0) {
        coder->dist_special[lVar12 + 1] = 0x400;
      }
      auVar19 = auVar16 ^ auVar2;
      iVar18 = auVar19._0_4_;
      iVar24 = auVar19._8_4_;
      auVar26._4_4_ = iVar18;
      auVar26._0_4_ = iVar18;
      auVar26._8_4_ = iVar24;
      auVar26._12_4_ = iVar24;
      auVar30._0_4_ = -(uint)(iVar18 < -0x7fffff8e);
      auVar30._4_4_ = -(uint)(iVar18 < -0x7fffff8e);
      auVar30._8_4_ = -(uint)(iVar24 < -0x7fffff8e);
      auVar30._12_4_ = -(uint)(iVar24 < -0x7fffff8e);
      auVar21._0_4_ = -(uint)(auVar19._4_4_ == -0x80000000);
      auVar21._4_4_ = -(uint)(auVar19._4_4_ == -0x80000000);
      auVar21._8_4_ = -(uint)(auVar19._12_4_ == -0x80000000);
      auVar21._12_4_ = -(uint)(auVar19._12_4_ == -0x80000000);
      auVar21 = auVar21 & auVar30;
      auVar19 = packssdw(auVar26,auVar21);
      auVar19 = packssdw(auVar19,auVar19);
      if ((auVar19 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        coder->dist_special[lVar12 + 2] = 0x400;
      }
      auVar19 = pshufhw(auVar21,auVar21,0x84);
      auVar19 = packssdw(auVar19,auVar19);
      if ((auVar19 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
        coder->dist_special[lVar12 + 3] = 0x400;
      }
      auVar19 = auVar15 ^ auVar2;
      iVar18 = auVar19._0_4_;
      iVar24 = auVar19._8_4_;
      auVar27._4_4_ = iVar18;
      auVar27._0_4_ = iVar18;
      auVar27._8_4_ = iVar24;
      auVar27._12_4_ = iVar24;
      auVar31._0_4_ = -(uint)(iVar18 < -0x7fffff8e);
      auVar31._4_4_ = -(uint)(iVar18 < -0x7fffff8e);
      auVar31._8_4_ = -(uint)(iVar24 < -0x7fffff8e);
      auVar31._12_4_ = -(uint)(iVar24 < -0x7fffff8e);
      auVar22._0_4_ = -(uint)(auVar19._4_4_ == -0x80000000);
      auVar22._4_4_ = -(uint)(auVar19._4_4_ == -0x80000000);
      auVar22._8_4_ = -(uint)(auVar19._12_4_ == -0x80000000);
      auVar22._12_4_ = -(uint)(auVar19._12_4_ == -0x80000000);
      auVar22 = auVar22 & auVar31;
      auVar19 = pshuflw(auVar27,auVar22,0xe8);
      auVar19 = packssdw(auVar19,auVar19);
      if ((auVar19 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        coder->dist_special[lVar12 + 4] = 0x400;
      }
      auVar19 = packssdw(auVar22,auVar22);
      auVar19 = packssdw(auVar19,auVar19);
      if ((auVar19 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
        coder->dist_special[lVar12 + 5] = 0x400;
      }
      auVar19 = auVar14 ^ auVar2;
      iVar18 = auVar19._0_4_;
      iVar24 = auVar19._8_4_;
      auVar28._4_4_ = iVar18;
      auVar28._0_4_ = iVar18;
      auVar28._8_4_ = iVar24;
      auVar28._12_4_ = iVar24;
      auVar32._0_4_ = -(uint)(iVar18 < -0x7fffff8e);
      auVar32._4_4_ = -(uint)(iVar18 < -0x7fffff8e);
      auVar32._8_4_ = -(uint)(iVar24 < -0x7fffff8e);
      auVar32._12_4_ = -(uint)(iVar24 < -0x7fffff8e);
      auVar23._0_4_ = -(uint)(auVar19._4_4_ == -0x80000000);
      auVar23._4_4_ = -(uint)(auVar19._4_4_ == -0x80000000);
      auVar23._8_4_ = -(uint)(auVar19._12_4_ == -0x80000000);
      auVar23._12_4_ = -(uint)(auVar19._12_4_ == -0x80000000);
      auVar23 = auVar23 & auVar32;
      auVar19 = packssdw(auVar28,auVar23);
      auVar19 = packssdw(auVar19,auVar19);
      if ((auVar19 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        coder->dist_special[lVar12 + 6] = 0x400;
      }
      auVar19 = pshufhw(auVar23,auVar23,0x84);
      auVar19 = packssdw(auVar19,auVar19);
      if ((auVar19 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
        coder->dist_special[lVar12 + 7] = 0x400;
      }
      lVar12 = lVar12 + 8;
      lVar10 = auVar17._8_8_;
      auVar17._0_8_ = auVar17._0_8_ + 8;
      auVar17._8_8_ = lVar10 + 8;
      lVar10 = auVar16._8_8_;
      auVar16._0_8_ = auVar16._0_8_ + 8;
      auVar16._8_8_ = lVar10 + 8;
      lVar10 = auVar15._8_8_;
      auVar15._0_8_ = auVar15._0_8_ + 8;
      auVar15._8_8_ = lVar10 + 8;
      lVar10 = auVar14._8_8_;
      auVar14._0_8_ = auVar14._0_8_ + 8;
      auVar14._8_8_ = lVar10 + 8;
    } while (lVar12 != 0x78);
    papVar6 = coder->dist_slot;
    lVar12 = 0;
    do {
      lVar10 = 0;
      do {
        ppVar1 = *papVar6 + lVar10;
        ppVar1[0] = 0x400;
        ppVar1[1] = 0x400;
        ppVar1[2] = 0x400;
        ppVar1[3] = 0x400;
        ppVar1[4] = 0x400;
        ppVar1[5] = 0x400;
        ppVar1[6] = 0x400;
        ppVar1[7] = 0x400;
        lVar10 = lVar10 + 8;
      } while (lVar10 != 0x40);
      lVar12 = lVar12 + 1;
      papVar6 = papVar6 + 1;
    } while (lVar12 != 4);
    coder->dist_align[0] = 0x400;
    coder->dist_align[1] = 0x400;
    coder->dist_align[2] = 0x400;
    coder->dist_align[3] = 0x400;
    coder->dist_align[4] = 0x400;
    coder->dist_align[5] = 0x400;
    coder->dist_align[6] = 0x400;
    coder->dist_align[7] = 0x400;
    coder->dist_align[8] = 0x400;
    coder->dist_align[9] = 0x400;
    coder->dist_align[10] = 0x400;
    coder->dist_align[0xb] = 0x400;
    coder->dist_align[0xc] = 0x400;
    coder->dist_align[0xd] = 0x400;
    coder->dist_align[0xe] = 0x400;
    coder->dist_align[0xf] = 0x400;
    length_encoder_reset(&coder->match_len_encoder,1 << ((byte)options->pb & 0x1f),coder->fast_mode)
    ;
    length_encoder_reset(&coder->rep_len_encoder,1 << ((byte)options->pb & 0x1f),coder->fast_mode);
    coder->match_price_count = 0x7fffffff;
    coder->align_price_count = 0x7fffffff;
    coder->opts_end_index = 0;
    coder->opts_current_index = 0;
    lVar4 = LZMA_OK;
  }
  return lVar4;
}

Assistant:

extern lzma_ret
lzma_lzma_encoder_reset(lzma_lzma1_encoder *coder,
		const lzma_options_lzma *options)
{
	if (!is_options_valid(options))
		return LZMA_OPTIONS_ERROR;

	coder->pos_mask = (1U << options->pb) - 1;
	coder->literal_context_bits = options->lc;
	coder->literal_pos_mask = (1U << options->lp) - 1;

	// Range coder
	rc_reset(&coder->rc);

	// State
	coder->state = STATE_LIT_LIT;
	for (size_t i = 0; i < REPS; ++i)
		coder->reps[i] = 0;

	literal_init(coder->literal, options->lc, options->lp);

	// Bit encoders
	for (size_t i = 0; i < STATES; ++i) {
		for (size_t j = 0; j <= coder->pos_mask; ++j) {
			bit_reset(coder->is_match[i][j]);
			bit_reset(coder->is_rep0_long[i][j]);
		}

		bit_reset(coder->is_rep[i]);
		bit_reset(coder->is_rep0[i]);
		bit_reset(coder->is_rep1[i]);
		bit_reset(coder->is_rep2[i]);
	}

	for (size_t i = 0; i < FULL_DISTANCES - DIST_MODEL_END; ++i)
		bit_reset(coder->dist_special[i]);

	// Bit tree encoders
	for (size_t i = 0; i < DIST_STATES; ++i)
		bittree_reset(coder->dist_slot[i], DIST_SLOT_BITS);

	bittree_reset(coder->dist_align, ALIGN_BITS);

	// Length encoders
	length_encoder_reset(&coder->match_len_encoder,
			1U << options->pb, coder->fast_mode);

	length_encoder_reset(&coder->rep_len_encoder,
			1U << options->pb, coder->fast_mode);

	// Price counts are incremented every time appropriate probabilities
	// are changed. price counts are set to zero when the price tables
	// are updated, which is done when the appropriate price counts have
	// big enough value, and lzma_mf.read_ahead == 0 which happens at
	// least every OPTS (a few thousand) possible price count increments.
	//
	// By resetting price counts to UINT32_MAX / 2, we make sure that the
	// price tables will be initialized before they will be used (since
	// the value is definitely big enough), and that it is OK to increment
	// price counts without risk of integer overflow (since UINT32_MAX / 2
	// is small enough). The current code doesn't increment price counts
	// before initializing price tables, but it maybe done in future if
	// we add support for saving the state between LZMA2 chunks.
	coder->match_price_count = UINT32_MAX / 2;
	coder->align_price_count = UINT32_MAX / 2;

	coder->opts_end_index = 0;
	coder->opts_current_index = 0;

	return LZMA_OK;
}